

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_atomic.h
# Opt level: O0

int density::detail::mem_order_cnv(memory_order i_order)

{
  int local_c;
  memory_order i_order_local;
  
  switch(i_order) {
  case memory_order_relaxed:
    local_c = 0;
    break;
  case memory_order_consume:
    local_c = 1;
    break;
  case memory_order_acquire:
    local_c = 2;
    break;
  case memory_order_release:
    local_c = 3;
    break;
  case memory_order_acq_rel:
    local_c = 4;
    break;
  case memory_order_seq_cst:
  default:
    local_c = 5;
  }
  return local_c;
}

Assistant:

inline int mem_order_cnv(std::memory_order i_order)
        {
            switch (i_order)
            {
            case std::memory_order_acq_rel:
                return __ATOMIC_ACQ_REL;
            case std::memory_order_acquire:
                return __ATOMIC_ACQUIRE;
            case std::memory_order_consume:
                return __ATOMIC_CONSUME;
            case std::memory_order_relaxed:
                return __ATOMIC_RELAXED;
            case std::memory_order_release:
                return __ATOMIC_RELEASE;
            case std::memory_order_seq_cst:
            default:
                return __ATOMIC_SEQ_CST;
            }
        }